

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeT2LoadShift(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint16_t *Decoder_01;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar3;
  uint uVar4;
  
  uVar3 = Insn >> 0x10 & 0xf;
  if (uVar3 == 0xf) {
    uVar3 = MCInst_getOpcode(Inst);
    Decoder_00 = (void *)(ulong)uVar3;
    if ((int)uVar3 < 0x968) {
      if (uVar3 == 0x949) {
        uVar3 = 0x947;
      }
      else if (uVar3 == 0x958) {
        uVar3 = 0x956;
      }
      else {
        if (uVar3 != 0x960) {
          return MCDisassembler_Fail;
        }
        uVar3 = 0x95e;
      }
    }
    else if ((int)uVar3 < 0x9b0) {
      if (uVar3 == 0x968) {
        uVar3 = 0x966;
      }
      else {
        if (uVar3 != 0x971) {
          return MCDisassembler_Fail;
        }
        uVar3 = 0x96e;
      }
    }
    else if (uVar3 == 0x9b0) {
      uVar3 = 0x9af;
    }
    else {
      if (uVar3 != 0x9b4) {
        return MCDisassembler_Fail;
      }
      uVar3 = 0x9b3;
    }
    MCInst_setOpcode(Inst,uVar3);
    DVar2 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder_00);
    return DVar2;
  }
  uVar4 = Insn >> 0xc & 0xf;
  if (uVar4 == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x968) {
      return MCDisassembler_Fail;
    }
    if (uVar1 == 0x958) {
      MCInst_setOpcode(Inst,0x9ac);
    }
  }
  uVar1 = MCInst_getOpcode(Inst);
  if ((8 < uVar1 - 0x9ac) ||
     (Decoder_01 = (uint16_t *)0x111, Address_00 = extraout_RDX,
     (0x111U >> (uVar1 - 0x9ac & 0x1f) & 1) == 0)) {
    Decoder_01 = GPRDecoderTable;
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar4]);
    Address_00 = extraout_RDX_00;
  }
  DVar2 = DecodeT2AddrModeSOReg
                    (Inst,uVar3 << 6 | (Insn >> 4 & 3) + (Insn & 0xf) * 4,Address_00,Decoder_01);
  if (MCDisassembler_Success < DVar2) {
    return MCDisassembler_Fail;
  }
  return *(DecodeStatus *)(&DAT_001c3dc0 + (ulong)DVar2 * 4);
}

Assistant:

static DecodeStatus DecodeT2LoadShift(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned addrmode;
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);

	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBs:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRHs:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHs:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2LDRSBs:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRs:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2PLDs:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIs:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}

		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHs:
				return MCDisassembler_Fail;
			case ARM_t2LDRHs:
				// FIXME: this instruction is only available with MP extensions,
				// this should be checked first but we don't have access to the
				// feature bits here.
				MCInst_setOpcode(Inst, ARM_t2PLDWs);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDs:
		case ARM_t2PLDWs:
		case ARM_t2PLIs:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	addrmode = fieldFromInstruction_4(Insn, 4, 2);
	addrmode |= fieldFromInstruction_4(Insn, 0, 4) << 2;
	addrmode |= fieldFromInstruction_4(Insn, 16, 4) << 6;
	if (!Check(&S, DecodeT2AddrModeSOReg(Inst, addrmode, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}